

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O2

IntVect amrex::indexFromValue<amrex::FArrayBox,void>
                  (FabArray<amrex::FArrayBox> *mf,int comp,IntVect *nghost,
                  value_type_conflict2 value)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int i;
  long lVar4;
  int j;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  undefined4 uVar13;
  double *pdVar14;
  IntVect IVar15;
  Box local_ec;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  MFIter::MFIter(&mfi,&mf->super_FabArrayBase,true);
  uVar13 = 0x80000000;
  uVar8 = 0x80000000;
  iVar7 = -0x80000000;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_ec,&mfi,nghost);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,mf,&mfi);
    lVar6 = (long)local_ec.smallend.vect[2];
    pdVar12 = (double *)
              (local_d0.nstride * (long)comp * 8 +
               (lVar6 - local_d0.begin.z) * local_d0.kstride * 8 +
               ((long)local_ec.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 8 +
               (long)local_ec.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8 + (long)local_d0.p)
    ;
    for (; lVar5 = (long)local_ec.smallend.vect[1], pdVar14 = pdVar12,
        lVar6 <= local_ec.bigend.vect[2]; lVar6 = lVar6 + 1) {
      for (; lVar4 = (long)local_ec.smallend.vect[0], pdVar11 = pdVar14,
          lVar5 <= local_ec.bigend.vect[1]; lVar5 = lVar5 + 1) {
        for (; lVar4 <= local_ec.bigend.vect[0]; lVar4 = lVar4 + 1) {
          bVar1 = NAN(value);
          bVar2 = NAN(*pdVar11);
          bVar3 = value != *pdVar11;
          uVar9 = (int)lVar5;
          if (bVar3) {
            uVar9 = uVar13;
          }
          if (!bVar1 && !bVar2) {
            uVar13 = uVar9;
          }
          uVar9 = (int)lVar4;
          if (bVar3) {
            uVar9 = uVar8;
          }
          if (!bVar1 && !bVar2) {
            uVar8 = uVar9;
          }
          iVar10 = (int)lVar6;
          if (bVar3) {
            iVar10 = iVar7;
          }
          if (!bVar1 && !bVar2) {
            iVar7 = iVar10;
          }
          pdVar11 = pdVar11 + 1;
        }
        pdVar14 = pdVar14 + local_d0.jstride;
      }
      pdVar12 = pdVar12 + local_d0.kstride;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  IVar15.vect[1] = uVar13;
  IVar15.vect[0] = uVar8;
  IVar15.vect[2] = iVar7;
  return (IntVect)IVar15.vect;
}

Assistant:

IntVect
indexFromValue (FabArray<FAB> const& mf, int comp, IntVect const& nghost,
                typename FAB::value_type value)
{
    IntVect loc;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        amrex::Gpu::Buffer<int> aa({0,AMREX_D_DECL(0,0,0)});
        int* p = aa.data();
        // This is a device ptr to 1+AMREX_SPACEDIM int zeros.
        // The first is used as an atomic bool and the others for intvect.
        if (mf.isFusingCandidate()) {
            auto const& ma = mf.const_arrays();
            ParallelFor(mf, nghost, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                int* flag = p;
                if (*flag == 0) {
                    if (ma[box_no](i,j,k,comp) == value) {
                        if (Gpu::Atomic::Exch(flag,1) == 0) {
                            AMREX_D_TERM(p[1] = i;,
                                         p[2] = j;,
                                         p[3] = k;);
                        }
                    }
                }
            });
        } else {
            for (MFIter mfi(mf,MFItInfo().SetDeviceSync(false)); mfi.isValid(); ++mfi) {
                const Box& bx = amrex::grow(mfi.validbox(), nghost);
                auto const& arr = mf.const_array(mfi);
                amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    int* flag = p;
                    if (*flag == 0) {
                        if (arr(i,j,k,comp) == value) {
                            if (Gpu::Atomic::Exch(flag,1) == 0) {
                                AMREX_D_TERM(p[1] = i;,
                                             p[2] = j;,
                                             p[3] = k;);
                            }
                        }
                    }
                });
            }
        }
        int const* tmp = aa.copyToHost();
        AMREX_D_TERM(loc[0] = tmp[1];,
                     loc[1] = tmp[2];,
                     loc[2] = tmp[3];);
    }
    else
#endif
    {
        bool f = false;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        {
            IntVect priv_loc = IntVect::TheMinVector();
            for (MFIter mfi(mf,true); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(nghost);
                auto const& fab = mf.const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    if (fab(i,j,k,comp) == value) priv_loc = IntVect(AMREX_D_DECL(i,j,k));
                });
            }

            if (priv_loc.allGT(IntVect::TheMinVector())) {
                bool old;
// we should be able to test on _OPENMP < 201107 for capture (version 3.1)
// but we must work around a bug in gcc < 4.9
// And, with NVHPC 21.9, we see an ICE with the atomic capture (NV bug: #3390723)
#if defined(AMREX_USE_OMP) && defined(_OPENMP) && (_OPENMP < 201307 || defined(__NVCOMPILER)) // OpenMP 4.0
#pragma omp critical (amrex_indexfromvalue)
#elif defined(AMREX_USE_OMP)
#pragma omp atomic capture
#endif
                {
                    old = f;
                    f = true;
                }

                if (old == false) loc = priv_loc;
            }
        }
    }

    return loc;
}